

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# onesided.c
# Opt level: O0

int putn_intersect_coords(Integer g_a,Integer *lo,Integer *hi,Integer *ecoords)

{
  Integer IVar1;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  int i;
  int ndims;
  Integer in_stack_000001c0;
  int local_30;
  
  IVar1 = pnga_ndim(in_stack_000001c0);
  local_30 = 0;
  while( true ) {
    if ((int)IVar1 <= local_30) {
      return 1;
    }
    if ((*(long *)(in_RCX + (long)local_30 * 8) < *(long *)(in_RSI + (long)local_30 * 8)) ||
       (*(long *)(in_RDX + (long)local_30 * 8) < *(long *)(in_RCX + (long)local_30 * 8))) break;
    local_30 = local_30 + 1;
  }
  return 0;
}

Assistant:

static int putn_intersect_coords(Integer g_a, Integer *lo, Integer *hi, Integer *ecoords)
{
  int ndims, i;

  ndims = pnga_ndim(g_a);

  for (i = 0; i < ndims; i++)
    if ((ecoords[i] < lo[i]) || (ecoords[i] > hi[i]))
      return 0;

  return 1;
}